

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

round_direction
fmt::v9::detail::get_round_direction(uint64_t divisor,uint64_t remainder,uint64_t error)

{
  round_direction rVar1;
  
  if (divisor <= remainder) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/_deps/fmt-src/include/fmt/format.h"
                ,0x9ed,"");
  }
  if (error < divisor) {
    if (error < divisor - error) {
      if ((divisor - remainder < remainder) || (divisor + remainder * -2 < error * 2)) {
        if ((remainder < error) || (remainder - error < divisor - (remainder - error))) {
          rVar1 = unknown;
        }
        else {
          rVar1 = up;
        }
      }
      else {
        rVar1 = down;
      }
      return rVar1;
    }
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/_deps/fmt-src/include/fmt/format.h"
                ,0x9ef,"");
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/_deps/fmt-src/include/fmt/format.h"
              ,0x9ee,"");
}

Assistant:

get_round_direction(uint64_t divisor,
                                                         uint64_t remainder,
                                                         uint64_t error) {
  FMT_ASSERT(remainder < divisor, "");  // divisor - remainder won't overflow.
  FMT_ASSERT(error < divisor, "");      // divisor - error won't overflow.
  FMT_ASSERT(error < divisor - error, "");  // error * 2 won't overflow.
  // Round down if (remainder + error) * 2 <= divisor.
  if (remainder <= divisor - remainder && error * 2 <= divisor - remainder * 2)
    return round_direction::down;
  // Round up if (remainder - error) * 2 >= divisor.
  if (remainder >= error &&
      remainder - error >= divisor - (remainder - error)) {
    return round_direction::up;
  }
  return round_direction::unknown;
}